

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int SaveEXR(float *data,int width,int height,int components,int save_as_fp16,char *outfilename,
           char **err)

{
  value_type vVar1;
  ostream *this;
  void *this_00;
  float *__dest;
  reference pvVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  void *in_RDI;
  int in_R8D;
  int ret;
  int i_1;
  float *image_ptr [4];
  size_t i;
  vector<float,_std::allocator<float>_> images [4];
  EXRImage image;
  EXRHeader header;
  stringstream ss;
  char **in_stack_fffffffffffffb18;
  string *in_stack_fffffffffffffb20;
  EXRImage *pEVar3;
  EXRImage *this_01;
  undefined4 in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb3c;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffb40;
  vector<float,_std::allocator<float>_> *local_450;
  int local_42c;
  reference local_428;
  reference local_420;
  reference local_418;
  reference local_410;
  ulong local_400;
  vector<float,_std::allocator<float>_> local_3f8;
  char **in_stack_fffffffffffffc30;
  pointer in_stack_fffffffffffffc38;
  EXRHeader *in_stack_fffffffffffffc40;
  EXRImage *in_stack_fffffffffffffc48;
  vector<float,_std::allocator<float>_> local_3b0;
  EXRImage local_398 [3];
  char *local_300;
  void *local_2f8;
  int local_2f0;
  undefined4 local_2ec;
  void *local_2e8;
  string local_1e0 [48];
  stringstream local_1b0 [16];
  ostream local_1a0 [384];
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  void *local_10;
  int local_4;
  
  local_1c = in_ECX;
  if (((in_ECX == 1) || (in_ECX == 3)) || (in_ECX == 4)) {
    local_20 = in_R8D;
    local_18 = in_EDX;
    local_14 = in_ESI;
    local_10 = in_RDI;
    InitEXRHeader((EXRHeader *)0x46ba8c);
    if ((local_14 < 0x10) && (local_18 < 0x10)) {
      local_2ec = 0;
    }
    else {
      local_2ec = 3;
    }
    InitEXRImage(local_398);
    local_398[0].num_channels = local_1c;
    local_450 = &local_3f8;
    do {
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)0x46bb07);
      local_450 = local_450 + 1;
    } while ((EXRImage *)local_450 != local_398);
    if (local_1c == 1) {
      std::vector<float,_std::allocator<float>_>::resize
                (in_stack_fffffffffffffb40,
                 CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      __dest = std::vector<float,_std::allocator<float>_>::data
                         ((vector<float,_std::allocator<float>_> *)0x46bb66);
      memcpy(__dest,local_10,(long)(local_14 * local_18) << 2);
    }
    else {
      std::vector<float,_std::allocator<float>_>::resize
                (in_stack_fffffffffffffb40,
                 CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      std::vector<float,_std::allocator<float>_>::resize
                (in_stack_fffffffffffffb40,
                 CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      std::vector<float,_std::allocator<float>_>::resize
                (in_stack_fffffffffffffb40,
                 CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      std::vector<float,_std::allocator<float>_>::resize
                (in_stack_fffffffffffffb40,
                 CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
      for (local_400 = 0; local_400 < (ulong)(long)(local_14 * local_18); local_400 = local_400 + 1)
      {
        vVar1 = *(value_type *)((long)local_10 + (long)local_1c * local_400 * 4);
        pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](&local_3f8,local_400);
        *pvVar2 = vVar1;
        vVar1 = *(value_type *)((long)local_10 + (long)local_1c * local_400 * 4 + 4);
        pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)&stack0xfffffffffffffc20,
                            local_400);
        *pvVar2 = vVar1;
        vVar1 = *(value_type *)((long)local_10 + (long)local_1c * local_400 * 4 + 8);
        pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)&stack0xfffffffffffffc38,
                            local_400);
        *pvVar2 = vVar1;
        if (local_1c == 4) {
          vVar1 = *(value_type *)((long)local_10 + local_400 * 0x10 + 0xc);
          pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](&local_3b0,local_400);
          *pvVar2 = vVar1;
        }
      }
    }
    memset(&local_428,0,0x20);
    if (local_1c == 4) {
      local_428 = std::vector<float,_std::allocator<float>_>::at
                            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffb20,
                             (size_type)in_stack_fffffffffffffb18);
      local_420 = std::vector<float,_std::allocator<float>_>::at
                            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffb20,
                             (size_type)in_stack_fffffffffffffb18);
      local_418 = std::vector<float,_std::allocator<float>_>::at
                            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffb20,
                             (size_type)in_stack_fffffffffffffb18);
      local_410 = std::vector<float,_std::allocator<float>_>::at
                            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffb20,
                             (size_type)in_stack_fffffffffffffb18);
    }
    else if (local_1c == 3) {
      local_428 = std::vector<float,_std::allocator<float>_>::at
                            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffb20,
                             (size_type)in_stack_fffffffffffffb18);
      local_420 = std::vector<float,_std::allocator<float>_>::at
                            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffb20,
                             (size_type)in_stack_fffffffffffffb18);
      local_418 = std::vector<float,_std::allocator<float>_>::at
                            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffb20,
                             (size_type)in_stack_fffffffffffffb18);
    }
    else if (local_1c == 1) {
      local_428 = std::vector<float,_std::allocator<float>_>::at
                            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffb20,
                             (size_type)in_stack_fffffffffffffb18);
    }
    local_398[0].images = (uchar **)&local_428;
    local_398[0].width = local_14;
    local_398[0].height = local_18;
    local_2f0 = local_1c;
    local_300 = (char *)malloc((long)local_1c * 0x110);
    if (local_1c == 4) {
      strncpy(local_300,"A",0xff);
      strncpy(local_300 + 0x110,"B",0xff);
      strncpy(local_300 + 0x220,"G",0xff);
      strncpy(local_300 + 0x330,"R",0xff);
      local_300[1] = '\0';
      local_300[0x111] = '\0';
      local_300[0x221] = '\0';
      local_300[0x331] = '\0';
    }
    else if (local_1c == 3) {
      strncpy(local_300,"B",0xff);
      strncpy(local_300 + 0x110,"G",0xff);
      strncpy(local_300 + 0x220,"R",0xff);
      local_300[1] = '\0';
      local_300[0x111] = '\0';
      local_300[0x221] = '\0';
    }
    else {
      strncpy(local_300,"A",0xff);
      local_300[1] = '\0';
    }
    local_2f8 = malloc((long)local_2f0 << 2);
    local_2e8 = malloc((long)local_2f0 << 2);
    for (local_42c = 0; local_42c < local_2f0; local_42c = local_42c + 1) {
      *(undefined4 *)((long)local_2f8 + (long)local_42c * 4) = 2;
      if (local_20 < 1) {
        *(undefined4 *)((long)local_2e8 + (long)local_42c * 4) = 2;
      }
      else {
        *(undefined4 *)((long)local_2e8 + (long)local_42c * 4) = 1;
      }
    }
    local_4 = SaveEXRImageToFile(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                                 (char *)in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
    if (local_4 == 0) {
      free(local_300);
      free(local_2f8);
      free(local_2e8);
    }
    this_01 = local_398;
    do {
      pEVar3 = (EXRImage *)&this_01[-1].images;
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)this_01);
      this_01 = pEVar3;
    } while (pEVar3 != (EXRImage *)&local_3f8);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1b0);
    this = std::operator<<(local_1a0,"Unsupported component value : ");
    this_00 = (void *)std::ostream::operator<<(this,local_1c);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::__cxx11::stringstream::str();
    tinyexr::SetErrorMessage(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
    std::__cxx11::string::~string(local_1e0);
    local_4 = -3;
    std::__cxx11::stringstream::~stringstream(local_1b0);
  }
  return local_4;
}

Assistant:

int SaveEXR(const float *data, int width, int height, int components,
            const int save_as_fp16, const char *outfilename, const char **err) {
  if ((components == 1) || components == 3 || components == 4) {
    // OK
  } else {
    std::stringstream ss;
    ss << "Unsupported component value : " << components << std::endl;

    tinyexr::SetErrorMessage(ss.str(), err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  EXRHeader header;
  InitEXRHeader(&header);

  if ((width < 16) && (height < 16)) {
    // No compression for small image.
    header.compression_type = TINYEXR_COMPRESSIONTYPE_NONE;
  } else {
    header.compression_type = TINYEXR_COMPRESSIONTYPE_ZIP;
  }

  EXRImage image;
  InitEXRImage(&image);

  image.num_channels = components;

  std::vector<float> images[4];

  if (components == 1) {
    images[0].resize(static_cast<size_t>(width * height));
    memcpy(images[0].data(), data, sizeof(float) * size_t(width * height));
  } else {
    images[0].resize(static_cast<size_t>(width * height));
    images[1].resize(static_cast<size_t>(width * height));
    images[2].resize(static_cast<size_t>(width * height));
    images[3].resize(static_cast<size_t>(width * height));

    // Split RGB(A)RGB(A)RGB(A)... into R, G and B(and A) layers
    for (size_t i = 0; i < static_cast<size_t>(width * height); i++) {
      images[0][i] = data[static_cast<size_t>(components) * i + 0];
      images[1][i] = data[static_cast<size_t>(components) * i + 1];
      images[2][i] = data[static_cast<size_t>(components) * i + 2];
      if (components == 4) {
        images[3][i] = data[static_cast<size_t>(components) * i + 3];
      }
    }
  }

  float *image_ptr[4] = {0, 0, 0, 0};
  if (components == 4) {
    image_ptr[0] = &(images[3].at(0));  // A
    image_ptr[1] = &(images[2].at(0));  // B
    image_ptr[2] = &(images[1].at(0));  // G
    image_ptr[3] = &(images[0].at(0));  // R
  } else if (components == 3) {
    image_ptr[0] = &(images[2].at(0));  // B
    image_ptr[1] = &(images[1].at(0));  // G
    image_ptr[2] = &(images[0].at(0));  // R
  } else if (components == 1) {
    image_ptr[0] = &(images[0].at(0));  // A
  }

  image.images = reinterpret_cast<unsigned char **>(image_ptr);
  image.width = width;
  image.height = height;

  header.num_channels = components;
  header.channels = static_cast<EXRChannelInfo *>(malloc(
      sizeof(EXRChannelInfo) * static_cast<size_t>(header.num_channels)));
  // Must be (A)BGR order, since most of EXR viewers expect this channel order.
  if (components == 4) {
#ifdef _MSC_VER
    strncpy_s(header.channels[0].name, "A", 255);
    strncpy_s(header.channels[1].name, "B", 255);
    strncpy_s(header.channels[2].name, "G", 255);
    strncpy_s(header.channels[3].name, "R", 255);
#else
    strncpy(header.channels[0].name, "A", 255);
    strncpy(header.channels[1].name, "B", 255);
    strncpy(header.channels[2].name, "G", 255);
    strncpy(header.channels[3].name, "R", 255);
#endif
    header.channels[0].name[strlen("A")] = '\0';
    header.channels[1].name[strlen("B")] = '\0';
    header.channels[2].name[strlen("G")] = '\0';
    header.channels[3].name[strlen("R")] = '\0';
  } else if (components == 3) {
#ifdef _MSC_VER
    strncpy_s(header.channels[0].name, "B", 255);
    strncpy_s(header.channels[1].name, "G", 255);
    strncpy_s(header.channels[2].name, "R", 255);
#else
    strncpy(header.channels[0].name, "B", 255);
    strncpy(header.channels[1].name, "G", 255);
    strncpy(header.channels[2].name, "R", 255);
#endif
    header.channels[0].name[strlen("B")] = '\0';
    header.channels[1].name[strlen("G")] = '\0';
    header.channels[2].name[strlen("R")] = '\0';
  } else {
#ifdef _MSC_VER
    strncpy_s(header.channels[0].name, "A", 255);
#else
    strncpy(header.channels[0].name, "A", 255);
#endif
    header.channels[0].name[strlen("A")] = '\0';
  }

  header.pixel_types = static_cast<int *>(
      malloc(sizeof(int) * static_cast<size_t>(header.num_channels)));
  header.requested_pixel_types = static_cast<int *>(
      malloc(sizeof(int) * static_cast<size_t>(header.num_channels)));
  for (int i = 0; i < header.num_channels; i++) {
    header.pixel_types[i] =
        TINYEXR_PIXELTYPE_FLOAT;  // pixel type of input image

    if (save_as_fp16 > 0) {
      header.requested_pixel_types[i] =
          TINYEXR_PIXELTYPE_HALF;  // save with half(fp16) pixel format
    } else {
      header.requested_pixel_types[i] =
          TINYEXR_PIXELTYPE_FLOAT;  // save with float(fp32) pixel format(i.e.
                                    // no precision reduction)
    }
  }

  int ret = SaveEXRImageToFile(&image, &header, outfilename, err);
  if (ret != TINYEXR_SUCCESS) {
    return ret;
  }

  free(header.channels);
  free(header.pixel_types);
  free(header.requested_pixel_types);

  return ret;
}